

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom
          (EpsCopyInputStream *this,ZeroCopyInputStream *zcis,int limit)

{
  char *pcVar1;
  int *piVar2;
  int local_34;
  EpsCopyInputStream *local_30;
  char *res;
  ZeroCopyInputStream *pZStack_20;
  int limit_local;
  ZeroCopyInputStream *zcis_local;
  EpsCopyInputStream *this_local;
  
  res._4_4_ = limit;
  pZStack_20 = zcis;
  zcis_local = (ZeroCopyInputStream *)this;
  if (limit == -1) {
    this_local = (EpsCopyInputStream *)InitFrom(this,zcis);
  }
  else {
    this->overall_limit_ = limit;
    local_30 = (EpsCopyInputStream *)InitFrom(this,zcis);
    this->limit_ = res._4_4_ - ((int)this->buffer_end_ - (int)local_30);
    pcVar1 = this->buffer_end_;
    local_34 = 0;
    piVar2 = std::min<int>(&local_34,&this->limit_);
    this->limit_end_ = pcVar1 + *piVar2;
    this_local = local_30;
  }
  return (char *)this_local;
}

Assistant:

const char* InitFrom(io::ZeroCopyInputStream* zcis, int limit) {
    if (limit == -1) return InitFrom(zcis);
    overall_limit_ = limit;
    auto res = InitFrom(zcis);
    limit_ = limit - static_cast<int>(buffer_end_ - res);
    limit_end_ = buffer_end_ + (std::min)(0, limit_);
    return res;
  }